

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Namespace *
flatbuffers::anon_unknown_0::GetNamespace
          (string *qualified_name,
          vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *namespaces,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
          *namespaces_index)

{
  pointer *pppNVar1;
  iterator __position;
  mapped_type pNVar2;
  long lVar3;
  char *pcVar4;
  mapped_type *__args;
  Namespace *pNVar5;
  char *pcVar6;
  char cVar7;
  string namespace_name;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar7 = (char)qualified_name;
  lVar3 = std::__cxx11::string::rfind(cVar7,0x2e);
  if (lVar3 == -1) {
    pcVar4 = "";
    pcVar6 = "";
  }
  else {
    pcVar6 = (qualified_name->_M_dataplus)._M_p;
    pcVar4 = pcVar6 + lVar3;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar4);
  __args = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
           ::operator[](namespaces_index,&local_70);
  if (*__args == (mapped_type)0x0) {
    pNVar5 = (Namespace *)operator_new(0x20);
    (pNVar5->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar5->from_table = 0;
    (pNVar5->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar5->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *__args = pNVar5;
    __position._M_current =
         (namespaces->
         super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (namespaces->
        super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>>::
      _M_realloc_insert<flatbuffers::Namespace*const&>
                ((vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>> *)
                 namespaces,__position,__args);
    }
    else {
      *__position._M_current = pNVar5;
      pppNVar1 = &(namespaces->
                  super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    lVar3 = std::__cxx11::string::find(cVar7,0x2e);
    if (lVar3 != -1) {
      do {
        pNVar2 = *__args;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)qualified_name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar2,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar3 = std::__cxx11::string::find(cVar7,0x2e);
      } while (lVar3 != -1);
    }
  }
  pNVar2 = *__args;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return pNVar2;
}

Assistant:

static Namespace *GetNamespace(
    const std::string &qualified_name, std::vector<Namespace *> &namespaces,
    std::map<std::string, Namespace *> &namespaces_index) {
  size_t dot = qualified_name.find_last_of('.');
  std::string namespace_name = (dot != std::string::npos)
                                   ? std::string(qualified_name.c_str(), dot)
                                   : "";
  Namespace *&ns = namespaces_index[namespace_name];

  if (!ns) {
    ns = new Namespace();
    namespaces.push_back(ns);

    size_t pos = 0;

    for (;;) {
      dot = qualified_name.find('.', pos);
      if (dot == std::string::npos) { break; }
      ns->components.push_back(qualified_name.substr(pos, dot - pos));
      pos = dot + 1;
    }
  }

  return ns;
}